

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

void Cba_NtkInsertGroup(Cba_Ntk_t *p,Vec_Int_t *vObjs,Cba_Ntk_t *pSyn)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int iVar4;
  char *__assertion;
  int iVar5;
  
  p_00 = Cba_NtkCollectInFons(p,vObjs);
  p_01 = Cba_NtkCollectOutFons(p,vObjs);
  if ((pSyn->vInputs).nSize != p_00->nSize) {
    __assert_fail("Cba_NtkPiNum(pSyn) == Vec_IntSize(vFonIns)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cbaNtk.c"
                  ,0x45b,"void Cba_NtkInsertGroup(Cba_Ntk_t *, Vec_Int_t *, Cba_Ntk_t *)");
  }
  if ((pSyn->vOutputs).nSize != p_01->nSize) {
    __assert_fail("Cba_NtkPoNum(pSyn) == Vec_IntSize(vFonOuts)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cbaNtk.c"
                  ,0x45c,"void Cba_NtkInsertGroup(Cba_Ntk_t *, Vec_Int_t *, Cba_Ntk_t *)");
  }
  Cba_NtkCleanFonCopies(pSyn);
  for (iVar4 = 0; iVar4 < (pSyn->vInputs).nSize; iVar4 = iVar4 + 1) {
    iVar1 = Vec_IntEntry(&pSyn->vInputs,iVar4);
    iVar1 = Cba_ObjFon0(pSyn,iVar1);
    iVar2 = Vec_IntEntry(p_00,iVar4);
    Cba_FonSetCopy(pSyn,iVar1,iVar2);
  }
  Vec_IntFree(p_00);
  Cba_NtkCleanObjCopies(pSyn);
  iVar4 = 1;
  while (iVar1 = (pSyn->vObjType).nSize, iVar4 < iVar1) {
    iVar1 = Cba_ObjIsBox(pSyn,iVar4);
    if (iVar1 == 0) {
      iVar4 = iVar4 + 1;
    }
    else {
      iVar1 = Cba_ObjDup(p,pSyn,iVar4);
      iVar2 = Cba_ObjFon0(pSyn,iVar4);
      iVar4 = iVar4 + 1;
      iVar5 = 0;
      while( true ) {
        iVar3 = Cba_ObjFon0(pSyn,iVar4);
        if (iVar3 <= iVar2 + iVar5) break;
        iVar3 = Cba_ObjFon(p,iVar1,iVar5);
        Cba_FonSetCopy(pSyn,iVar2 + iVar5,iVar3);
        iVar5 = iVar5 + 1;
      }
    }
  }
  for (iVar4 = 1; iVar4 < iVar1; iVar4 = iVar4 + 1) {
    iVar1 = Cba_ObjIsBox(pSyn,iVar4);
    if (iVar1 != 0) {
      iVar1 = Cba_ObjCopy(pSyn,iVar4);
      iVar2 = Cba_ObjFin0(pSyn,iVar4);
      iVar5 = 0;
      while( true ) {
        iVar3 = Cba_ObjFin0(pSyn,iVar4 + 1);
        if (iVar3 <= iVar5 + iVar2) break;
        iVar3 = Cba_FinFon(pSyn,iVar5 + iVar2);
        iVar3 = Cba_FonCopy(pSyn,iVar3);
        Cba_ObjSetFinFon(p,iVar1,iVar5,iVar3);
        iVar5 = iVar5 + 1;
      }
    }
    iVar1 = (pSyn->vObjType).nSize;
  }
  Cba_NtkCleanFonCopies(p);
  if (0 < (p->vFonName).nSize) {
    Vec_IntFillExtra(&p->vFonName,(p->vFonObj).nSize,0);
  }
  iVar4 = 0;
  do {
    if ((pSyn->vOutputs).nSize <= iVar4) {
      Vec_IntFree(p_01);
      for (iVar4 = 1; iVar4 < (p->vFinFon).nSize; iVar4 = iVar4 + 1) {
        iVar1 = Vec_IntEntry(&p->vFinFon,iVar4);
        if ((0 < iVar1) && (iVar2 = Cba_FonCopy(p,iVar1), iVar2 != 0)) {
          iVar1 = Cba_FonCopy(p,iVar1);
          Vec_IntWriteEntry(&p->vFinFon,iVar4,iVar1);
        }
      }
      Cba_NtkMissingFonNames(p,"j");
      return;
    }
    iVar1 = Vec_IntEntry(&pSyn->vOutputs,iVar4);
    iVar1 = Cba_ObjFinFon(pSyn,iVar1,0);
    iVar2 = Cba_FonCopy(pSyn,iVar1);
    if (iVar2 < 1) {
      __assert_fail("Cba_FonIsReal(Cba_FonCopy(pSyn, iFon))",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cbaNtk.c"
                    ,0x477,"void Cba_NtkInsertGroup(Cba_Ntk_t *, Vec_Int_t *, Cba_Ntk_t *)");
    }
    iVar2 = Vec_IntEntry(p_01,iVar4);
    iVar5 = Cba_FonCopy(pSyn,iVar1);
    Cba_FonSetCopy(p,iVar2,iVar5);
    if (0 < (p->vFonName).nSize) {
      iVar1 = Cba_FonCopy(pSyn,iVar1);
      iVar2 = Vec_IntEntry(p_01,iVar4);
      iVar2 = Cba_FonName(p,iVar2);
      Cba_FonSetName(p,iVar1,iVar2);
      iVar1 = Vec_IntEntry(p_01,iVar4);
      if ((p->vFonName).nSize < 1) {
        __assertion = "Cba_NtkHasFonNames(p)";
LAB_002f6f68:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cba.h"
                      ,0x18d,"void Cba_FonCleanName(Cba_Ntk_t *, int)");
      }
      if (iVar1 < 1) {
        __assertion = "Cba_FonIsReal(f)";
        goto LAB_002f6f68;
      }
      iVar2 = Cba_FonName(p,iVar1);
      if (iVar2 == 0) {
        __assertion = "Cba_FonName(p, f) != 0";
        goto LAB_002f6f68;
      }
      Vec_IntSetEntry(&p->vFonName,iVar1,0);
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void Cba_NtkInsertGroup( Cba_Ntk_t * p, Vec_Int_t * vObjs, Cba_Ntk_t * pSyn )
{
    Vec_Int_t * vFonIns  = Cba_NtkCollectInFons( p, vObjs );
    Vec_Int_t * vFonOuts = Cba_NtkCollectOutFons( p, vObjs );
    int k, iObj, iObjNew, iFin, iFon;
    assert( Cba_NtkPiNum(pSyn) == Vec_IntSize(vFonIns) );
    assert( Cba_NtkPoNum(pSyn) == Vec_IntSize(vFonOuts) );
    // mark AIG with the input fons
    Cba_NtkCleanFonCopies( pSyn );
    Cba_NtkForEachPiFon( pSyn, iObj, iFon, k )
        Cba_FonSetCopy( pSyn, iFon, Vec_IntEntry(vFonIns, k) );
    Vec_IntFree( vFonIns );
    // build up internal nodes
    Cba_NtkCleanObjCopies( pSyn );
    Cba_NtkForEachBox( pSyn, iObj )
    {
        iObjNew = Cba_ObjDup( p, pSyn, iObj );
        Cba_ObjForEachFon( pSyn, iObj, iFon, k )
            Cba_FonSetCopy( pSyn, iFon, Cba_ObjFon(p, iObjNew, k) );
    }
    // connect internal nodes
    Cba_NtkForEachBox( pSyn, iObj )
    {
        iObjNew = Cba_ObjCopy( pSyn, iObj );
        Cba_ObjForEachFinFon( pSyn, iObj, iFin, iFon, k )
            Cba_ObjSetFinFon( p, iObjNew, k, Cba_FonCopy(pSyn, iFon) );
    }
    // connect output fons
    Cba_NtkCleanFonCopies( p );
    if ( Cba_NtkHasFonNames(p) )
        Vec_IntFillExtra( &p->vFonName, Cba_NtkFonNum(p) + 1, 0 );
    Cba_NtkForEachPoDriverFon( pSyn, iObj, iFon, k )
    {
        assert( Cba_FonIsReal(Cba_FonCopy(pSyn, iFon)) );
        Cba_FonSetCopy( p, Vec_IntEntry(vFonOuts, k), Cba_FonCopy(pSyn, iFon) );
        // transfer names
        if ( Cba_NtkHasFonNames(p) )
        {
            Cba_FonSetName( p, Cba_FonCopy(pSyn, iFon), Cba_FonName(p, Vec_IntEntry(vFonOuts, k)) );
            Cba_FonCleanName( p, Vec_IntEntry(vFonOuts, k) );
        }
    }
    Vec_IntFree( vFonOuts );
    // delete nodes
//    Vec_IntForEachEntry( vObjs, iObj, k )
//        Cba_ObjDelete( p, iObj );
    // update fins pointing to output fons to point to the new fons
    Cba_NtkForEachFinFon( p, iFon, iFin )
        if ( Cba_FonIsReal(iFon) && Cba_FonCopy(p, iFon) )
            Cba_PatchFinFon( p, iFin, Cba_FonCopy(p, iFon) );
    Cba_NtkMissingFonNames( p, "j" );
/*
    // duplicate in DFS order
    pNew = Cba_NtkDupOrder( p->pDesign, p, Cba_NtkCollectDfs );
    Cba_NtkDupAttrs( pNew, p );
    // replace "p" with "pNew"
    Cba_NtkUpdate( Cba_NtkMan(p), pNew ); // removes "p"
    return pNew;
*/
}